

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIExternalCommand::startExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti)

{
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  string *psVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  BuildNode *local_58;
  StringRef local_50 [2];
  
  this_00 = &(this->super_ExternalCommand).super_Command.outputs;
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::reserve(this_00,(ulong)(this->outputNodeNames).
                           super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           .super_SmallVectorBase.Size);
  psVar1 = (string *)
           (this->outputNodeNames).
           super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           .super_SmallVectorBase.BeginX;
  for (lVar2 = (ulong)(this->outputNodeNames).
                      super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      .super_SmallVectorBase.Size << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
    std::__cxx11::string::string((string *)local_50,psVar1);
    local_58 = llbuild::buildsystem::BuildSystem::lookupNode(system,local_50[0]);
    std::vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>::
    emplace_back<llbuild::buildsystem::BuildNode*>
              ((vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>
                *)this_00,&local_58);
    std::__cxx11::string::_M_dispose();
    psVar1 = psVar1 + 0x20;
  }
  (*(this->cAPIDelegate).start)
            ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
             (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti);
  return;
}

Assistant:

virtual void startExternalCommand(BuildSystem& system,
                                    core::TaskInterface ti) override {
    outputs.reserve(outputNodeNames.size());
    for (auto name: outputNodeNames) {
      outputs.push_back(system.lookupNode(name));
    }
    cAPIDelegate.start(cAPIDelegate.context,
                       (llb_buildsystem_command_t*)this,
                       (llb_buildsystem_interface_t*)&system,
                       *reinterpret_cast<llb_task_interface_t*>(&ti));
  }